

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

FunctionPortListSyntax * __thiscall
slang::parsing::Parser::parseFunctionPortList
          (Parser *this,bitmask<slang::parsing::detail::FunctionOptions> options)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  FunctionPortBaseSyntax *pFVar4;
  undefined4 extraout_var;
  FunctionPortListSyntax *pFVar5;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  TokenKind TVar6;
  Token TVar7;
  Token TVar8;
  Token TVar9;
  Token openParen;
  Token closeParen;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_168;
  Info *local_158;
  undefined8 local_150;
  Info *local_148;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_140;
  ulong local_130;
  undefined8 uStack_128;
  undefined8 local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (!bVar1) {
    return (FunctionPortListSyntax *)0x0;
  }
  TVar7 = ParserBase::consume(&this->super_ParserBase);
  local_148 = TVar7.info;
  uVar3 = TVar7._0_8_;
  Token::Token(&local_168);
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7.kind);
  if (bVar1) {
    local_168 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleFunctionPort(TVar7.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar7,CloseParenthesis,&local_168,(DiagCode)0x3d0005);
      src = extraout_RDX_03;
      goto LAB_003babf6;
    }
    do {
      local_150 = uVar3;
      local_158 = TVar7.info;
      uVar3 = TVar7._0_8_;
      pFVar4 = parseFunctionPort(this,options);
      local_140._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pFVar4;
      local_130 = CONCAT71(local_130._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_140._M_first);
      TVar8 = ParserBase::peek(&this->super_ParserBase);
      TVar6 = TVar8.kind;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
      TVar8.info = local_158;
      TVar8.kind = (short)uVar3;
      TVar8._2_1_ = (char)((ulong)uVar3 >> 0x10);
      TVar8.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
      TVar8.rawLen = (int)((ulong)uVar3 >> 0x20);
      iVar2 = 3;
      src = extraout_RDX;
      if (TVar6 != EndOfFile && !bVar1) {
        if (TVar6 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleFunctionPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x3d0005,false);
            if (!bVar1) {
              local_168 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
              TVar8.info = local_158;
              TVar8.kind = (short)uVar3;
              TVar8._2_1_ = (char)((ulong)uVar3 >> 0x10);
              TVar8.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
              TVar8.rawLen = (int)((ulong)uVar3 >> 0x20);
              src = local_168.info;
              iVar2 = 1;
              goto LAB_003babaf;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_140._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_130 = local_130 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_108,(TokenOrSyntax *)&local_140._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        TVar6 = TVar9.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
        if (TVar6 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          TVar8.info = local_158;
          TVar8.kind = (short)uVar3;
          TVar8._2_1_ = (char)((ulong)uVar3 >> 0x10);
          TVar8.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
          TVar8.rawLen = (int)((ulong)uVar3 >> 0x20);
          src = extraout_RDX_01;
        }
        else {
          src = extraout_RDX_00;
          if (local_158 == TVar9.info && TVar7.kind == TVar6) {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleFunctionPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x3d0005,true);
            TVar8.info = local_158;
            TVar8.kind = (short)uVar3;
            TVar8._2_1_ = (char)((ulong)uVar3 >> 0x10);
            TVar8.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
            TVar8.rawLen = (int)((ulong)uVar3 >> 0x20);
            src = extraout_RDX_02;
            if (!bVar1) goto LAB_003babaf;
          }
          iVar2 = 0;
          TVar8 = TVar9;
        }
      }
LAB_003babaf:
      TVar7 = TVar8;
      uVar3 = local_150;
      local_158 = TVar7.info;
    } while (iVar2 == 0);
    if (iVar2 != 3) goto LAB_003babf6;
    local_168 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  src = local_168.info;
LAB_003babf6:
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = CONCAT44(extraout_var,iVar2);
  local_140._8_4_ = 3;
  local_130 = 0;
  uStack_128 = 0;
  local_140._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005d5da8;
  openParen.info = local_148;
  openParen.kind = (short)uVar3;
  openParen._2_1_ = (char)((ulong)uVar3 >> 0x10);
  openParen.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  openParen.rawLen = (int)((ulong)uVar3 >> 0x20);
  pFVar5 = slang::syntax::SyntaxFactory::functionPortList
                     (&this->factory,openParen,
                      (SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *)
                      &local_140._M_first,local_168);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    operator_delete(local_108[0].data_);
  }
  return pFVar5;
}

Assistant:

FunctionPortListSyntax* Parser::parseFunctionPortList(bitmask<FunctionOptions> options) {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto openParen = consume();
    Token closeParen;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleFunctionPort, isEndOfParenList>(
        buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedFunctionPort, [this, options] { return &parseFunctionPort(options); });

    return &factory.functionPortList(openParen, buffer.copy(alloc), closeParen);
}